

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedHybridMeshControl.cpp
# Opt level: O0

void __thiscall
TPZMHMixedHybridMeshControl::CreateInternalFluxElements(TPZMHMixedHybridMeshControl *this)

{
  bool bVar1;
  int iVar2;
  TPZGeoMesh *pTVar3;
  TPZCompMesh *pTVar4;
  int64_t iVar5;
  pointer ppVar6;
  TPZGeoEl *subdomain;
  long *plVar7;
  _Rb_tree_iterator<std::pair<const_long,_long>_> *in_RDI;
  TPZCompEl *cel;
  int64_t gelMHM;
  int geldim;
  TPZGeoEl *gel_1;
  int64_t el;
  int64_t MHMIndex;
  iterator it;
  int64_t nel;
  TPZGeoEl *gsubel;
  TPZGeoEl *gel;
  TPZCompMesh *cmeshHDiv;
  int meshdim;
  TPZGeoMesh *gmesh;
  TPZMHMixedHybridMeshControl *in_stack_000001a0;
  TPZMHMixedHybridMeshControl *in_stack_000001d0;
  TPZGeoEl *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  _Self in_stack_ffffffffffffff80;
  int64_t in_stack_ffffffffffffff88;
  TPZManVector<long,_10> *in_stack_ffffffffffffff90;
  TPZMHMeshControl *pTVar8;
  key_type *in_stack_ffffffffffffffa8;
  TPZCompEl *cel_00;
  map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
  *in_stack_ffffffffffffffb0;
  TPZMHMeshControl *this_00;
  _Self local_48;
  _Self local_40;
  undefined8 in_stack_ffffffffffffffc8;
  int dimension;
  TPZCreateApproximationSpace *in_stack_ffffffffffffffd0;
  
  dimension = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pTVar3 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
  iVar2 = TPZGeoMesh::Dimension(pTVar3);
  pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x3d));
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_ffffffffffffff80._M_node);
  TPZCompMesh::LoadReferences((TPZCompMesh *)in_stack_ffffffffffffff80._M_node);
  TPZCompMesh::SetDimModel(pTVar4,iVar2);
  TPZCompMesh::ApproxSpace(pTVar4);
  TPZCreateApproximationSpace::SetAllCreateFunctionsHDiv(in_stack_ffffffffffffffd0,dimension);
  TPZCompMesh::SetDefaultOrder(pTVar4,*(int *)&in_RDI[0x16]._M_node);
  std::
  map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
  ::operator[](in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  TPZManVector<long,_10>::Expand(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
  iVar5 = TPZGeoMesh::NElements((TPZGeoMesh *)0x1e32348);
  local_40._M_node =
       (_Base_ptr)
       std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::begin
                 ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *
                  )in_stack_ffffffffffffff68);
  while( true ) {
    local_48._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                   ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                     *)in_stack_ffffffffffffff68);
    bVar1 = std::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
    TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_ffffffffffffff80._M_node);
    ppVar6 = std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1e323b1);
    this_00 = (TPZMHMeshControl *)ppVar6->first;
    for (cel_00 = (TPZCompEl *)0x0; (long)cel_00 < iVar5; cel_00 = (TPZCompEl *)&cel_00->field_0x1)
    {
      TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
      subdomain = TPZGeoMesh::Element((TPZGeoMesh *)
                                      CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                                      (int64_t)in_stack_ffffffffffffff68);
      if (subdomain != (TPZGeoEl *)0x0) {
        (**(code **)(*(long *)subdomain + 0x210))();
        plVar7 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x19),(int64_t)cel_00);
        pTVar8 = (TPZMHMeshControl *)*plVar7;
        if (subdomain != (TPZGeoEl *)0x0) {
          in_stack_ffffffffffffff74 = (**(code **)(*(long *)subdomain + 0x210))();
          pTVar3 = TPZAutoPointer<TPZGeoMesh>::operator->
                             ((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
          iVar2 = TPZGeoMesh::Dimension(pTVar3);
          if (((in_stack_ffffffffffffff74 == iVar2) &&
              (iVar2 = (**(code **)(*(long *)subdomain + 0x1d0))(), iVar2 == 0)) &&
             (pTVar8 == this_00)) {
            in_stack_ffffffffffffff68 =
                 (TPZGeoEl *)
                 TPZCompMesh::CreateCompEl
                           ((TPZCompMesh *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                            in_stack_ffffffffffffff68);
            std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator->
                      ((_Rb_tree_iterator<std::pair<const_long,_long>_> *)0x1e324b1);
            TPZMHMeshControl::SetSubdomain(this_00,cel_00,(int64_t)subdomain);
          }
        }
      }
    }
    in_stack_ffffffffffffff80 =
         std::_Rb_tree_iterator<std::pair<const_long,_long>_>::operator++
                   (in_RDI,in_stack_ffffffffffffff74);
  }
  TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
  TPZGeoMesh::ResetReference((TPZGeoMesh *)in_stack_ffffffffffffff80._M_node);
  pTVar4 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x3d));
  (**(code **)(*(long *)pTVar4 + 0x60))();
  SplitFluxElementsAroundFractures(in_stack_000001d0);
  CreateHDivWrappers(in_stack_000001a0);
  return;
}

Assistant:

void TPZMHMixedHybridMeshControl::CreateInternalFluxElements()
{
    TPZGeoMesh *gmesh = fGMesh.operator->();
    int meshdim = gmesh->Dimension();
    TPZCompMesh * cmeshHDiv = fFluxMesh.operator->();
    gmesh->ResetReference();
    cmeshHDiv->LoadReferences();
    cmeshHDiv->SetDimModel(meshdim);
    cmeshHDiv->ApproxSpace().SetAllCreateFunctionsHDiv(meshdim);
    cmeshHDiv->SetDefaultOrder(fpOrderInternal);
    
    //Criar elementos computacionais malha MHM
    
    TPZGeoEl *gel = NULL;
    TPZGeoEl *gsubel = NULL;
    fConnectToSubDomainIdentifier[cmeshHDiv].Expand(10000);
    int64_t nel = fGMesh->NElements();
    
    for (auto it= this->fMHMtoSubCMesh.begin(); it != this->fMHMtoSubCMesh.end(); it++)
    {
        fGMesh->ResetReference();
        int64_t MHMIndex = it->first;
        for (int64_t el = 0; el< nel; el++) {
            TPZGeoEl *gel = fGMesh->Element(el);
            if(!gel) continue;
            int geldim = gel->Dimension();
            int64_t gelMHM = fGeoToMHMDomain[el];
            if(!gel || gel->Dimension() != fGMesh->Dimension() || gel->HasSubElement() || gelMHM != MHMIndex)
            {
                continue;
            }
            // create the flux element
            
            TPZCompEl *cel = cmeshHDiv->CreateCompEl(gel);
            /// associate the connects with the subdomain
            SetSubdomain(cel, it->first);
        }
    }
    
    fGMesh->ResetReference();    
    fFluxMesh->ExpandSolution();
    
    SplitFluxElementsAroundFractures();

    CreateHDivWrappers();
}